

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_MacroArgs_EvaluateOnceBool::Run(void)

{
  char *pcVar1;
  FlagSettingMode in_R8D;
  FlagSaver fs;
  string local_28;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","MacroArgs","EvaluateOnceBool");
  if (fLB::FLAGS_changeable_bool_var == '\0') {
    pcVar1 = "FLAGS_changeable_bool_var";
  }
  else {
    if (changeable_bool_var != 0x1f49) {
      fprintf(_stderr,"Check failed: %s %s %s\n","8009","==","changeable_bool_var");
      goto LAB_00134fdb;
    }
    SetCommandLineOptionWithMode_abi_cxx11_(&local_28,(gflags *)0x14b95d,"false",(char *)0x1,in_R8D)
    ;
    std::__cxx11::string::~string((string *)&local_28);
    if (fLB::FLAGS_changeable_bool_var != '\x01') {
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    pcVar1 = "!(FLAGS_changeable_bool_var)";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar1);
LAB_00134fdb:
  exit(1);
}

Assistant:

TEST(MacroArgs, EvaluateOnceBool) {
  EXPECT_TRUE(FLAGS_changeable_bool_var);
  EXPECT_TRUE(FLAGS_changeable_bool_var);
  EXPECT_EQ(8009, changeable_bool_var);
  SetCommandLineOptionWithMode("changeable_bool_var", "false",
                               SET_FLAG_IF_DEFAULT);
  EXPECT_FALSE(FLAGS_changeable_bool_var);
}